

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandSynch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nWords;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  uint fVerbose;
  int fDelete2;
  int fDelete1;
  Abc_Ntk_t *pNtk2;
  uint local_44;
  Abc_Ntk_t *local_40;
  Abc_Ntk_t *pNtk1;
  
  local_40 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fVerbose = 1;
  nWords = 0x20;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Wvh"), iVar2 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (argc == globalUtilOptind) {
        if (local_40 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
          iVar2 = -1;
          goto LAB_0021a966;
        }
        pNtk = Abc_NtkDarSynchOne(local_40,nWords,fVerbose);
      }
      else {
        iVar2 = Abc_NtkPrepareTwoNtks
                          (_stdout,local_40,argv + globalUtilOptind,argc - globalUtilOptind,&pNtk1,
                           &pNtk2,&fDelete1,&fDelete2);
        if (iVar2 == 0) {
          return 1;
        }
        if ((pNtk1->nObjCounts[8] == 0) || (pNtk2->nObjCounts[8] == 0)) {
          if (fDelete1 != 0) {
            Abc_NtkDelete(pNtk1);
          }
          if (fDelete2 != 0) {
            Abc_NtkDelete(pNtk2);
          }
          pcVar3 = "The network has no latches..\n";
          goto LAB_0021a7e8;
        }
        pNtk = Abc_NtkDarSynch(pNtk1,pNtk2,nWords,fVerbose);
        if (fDelete1 != 0) {
          Abc_NtkDelete(pNtk1);
        }
        if (fDelete2 != 0) {
          Abc_NtkDelete(pNtk2);
        }
      }
      if (pNtk != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
        return 0;
      }
      pcVar3 = "Synchronization has failed.\n";
LAB_0021a7e8:
      Abc_Print(-1,pcVar3);
      return 0;
    }
    if (iVar1 != 0x57) goto LAB_0021a813;
    local_44 = nWords;
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
      nWords = local_44;
      goto LAB_0021a813;
    }
    nWords = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)nWords < 1) {
LAB_0021a813:
      Abc_Print(-2,"usage: synch [-W <num>] [-vh] <file1> <file2>\n");
      Abc_Print(-2,"\t         derives and applies synchronization sequence\n");
      Abc_Print(-2,"\t-W num : the number of simulation words [default = %d]\n",(ulong)nWords);
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first design\n");
      Abc_Print(-2,"\tfile2  : (optional) the file with the second design\n\n");
      Abc_Print(-2,"\t         If no designs are given on the command line,\n");
      Abc_Print(-2,"\t         assumes the current network has no initial state,\n");
      Abc_Print(-2,"\t         derives synchronization sequence and applies it.\n\n");
      Abc_Print(-2,"\t         If two designs are given on the command line\n");
      Abc_Print(-2,"\t         assumes both of them have no initial state,\n");
      Abc_Print(-2,"\t         derives sequences for both designs, synchorinizes\n");
      Abc_Print(-2,"\t         them, and creates SEC miter comparing two designs.\n\n");
      Abc_Print(-2,"\t         If only one design is given on the command line,\n");
      Abc_Print(-2,"\t         considers the second design to be the current network,\n");
      pcVar3 = "\t         and derives SEC miter for them, as described above.\n";
      iVar2 = -2;
LAB_0021a966:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSynch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtkRes, * pNtk1, * pNtk2, * pNtk;
    char ** pArgvNew;
    int nArgcNew;
    int fDelete1, fDelete2;
    int c;
    int nWords;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarSynch( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nWords, int fVerbose );
    extern Abc_Ntk_t * Abc_NtkDarSynchOne( Abc_Ntk_t * pNtk, int nWords, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nWords   =  32;
    fVerbose =   1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Wvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords <= 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew == 0 )
    {
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Empty network.\n" );
            return 1;
        }
        pNtkRes = Abc_NtkDarSynchOne( pNtk, nWords, fVerbose );
    }
    else
    {
        if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
            return 1;
        if ( Abc_NtkLatchNum(pNtk1) == 0 || Abc_NtkLatchNum(pNtk2) == 0 )
        {
            if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
            if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
            Abc_Print( -1, "The network has no latches..\n" );
            return 0;
        }

        // modify the current network
        pNtkRes = Abc_NtkDarSynch( pNtk1, pNtk2, nWords, fVerbose );
        if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
        if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Synchronization has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: synch [-W <num>] [-vh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         derives and applies synchronization sequence\n" );
    Abc_Print( -2, "\t-W num : the number of simulation words [default = %d]\n", nWords );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first design\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second design\n\n");
    Abc_Print( -2, "\t         If no designs are given on the command line,\n" );
    Abc_Print( -2, "\t         assumes the current network has no initial state,\n" );
    Abc_Print( -2, "\t         derives synchronization sequence and applies it.\n\n" );
    Abc_Print( -2, "\t         If two designs are given on the command line\n" );
    Abc_Print( -2, "\t         assumes both of them have no initial state,\n" );
    Abc_Print( -2, "\t         derives sequences for both designs, synchorinizes\n" );
    Abc_Print( -2, "\t         them, and creates SEC miter comparing two designs.\n\n" );
    Abc_Print( -2, "\t         If only one design is given on the command line,\n" );
    Abc_Print( -2, "\t         considers the second design to be the current network,\n" );
    Abc_Print( -2, "\t         and derives SEC miter for them, as described above.\n" );
    return 1;
}